

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

int __thiscall ON_ClippingRegion::InClipPlaneRegion(ON_ClippingRegion *this,int count,ON_3fPoint *p)

{
  double dVar1;
  double clip_plane_tolerance;
  int j;
  int i;
  uint cpbit;
  uint some_out;
  uint all_out;
  uint out;
  double x;
  float *cv;
  ON_PlaneEquation *cpeqn;
  ON_3fPoint *p_local;
  int count_local;
  ON_ClippingRegion *this_local;
  
  dVar1 = ClipPlaneTolerance(this);
  if ((count < 1) || (p == (ON_3fPoint *)0x0)) {
    this_local._4_4_ = 0;
  }
  else if (this->m_clip_plane_count < 1) {
    this_local._4_4_ = 2;
  }
  else {
    i = 0;
    cpbit = 0xffffffff;
    clip_plane_tolerance._4_4_ = count;
    x = (double)p;
    while (clip_plane_tolerance._4_4_ != 0) {
      some_out = 0;
      j = 0x40;
      cv = (float *)&this->field_0x110;
      clip_plane_tolerance._0_4_ = this->m_clip_plane_count;
      while (clip_plane_tolerance._0_4_ != 0) {
        if (*(double *)(cv + 4) * (double)*(float *)((long)x + 8) +
            *(double *)cv * (double)*(float *)x +
            *(double *)(cv + 2) * (double)*(float *)((long)x + 4) + *(double *)(cv + 6) < -dVar1) {
          some_out = j | some_out;
        }
        j = j << 1;
        cv = cv + 8;
        clip_plane_tolerance._0_4_ = clip_plane_tolerance._0_4_ + -1;
      }
      i = some_out | i;
      cpbit = some_out & cpbit;
      if ((i != 0) && (cpbit == 0)) break;
      x = (double)((long)x + 0xc);
      clip_plane_tolerance._4_4_ = clip_plane_tolerance._4_4_ + -1;
    }
    if (cpbit == 0) {
      if (i == 0) {
        clip_plane_tolerance._4_4_ = 2;
      }
      else {
        clip_plane_tolerance._4_4_ = 1;
      }
    }
    else {
      clip_plane_tolerance._4_4_ = 0;
    }
    this_local._4_4_ = clip_plane_tolerance._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int ON_ClippingRegion::InClipPlaneRegion( 
  int count, 
  const ON_3fPoint* p
  ) const
{
  const ON_PlaneEquation* cpeqn;
  const float* cv;
  double x;
  unsigned int out, all_out, some_out, cpbit;
  int i, j;

  // 14 May 2012 Dale Lear
  //   Fix http://dev.mcneel.com/bugtrack/?q=102481
  //   Picking hatches that are coplanar with clipping planes.
  //   The "fix" was to set clipping_plane_tolerance = same
  //   tolerance the display code uses.  Before the fix,
  //   0.0 was used as the clipping_plane_tolerance.
  const double clip_plane_tolerance = ClipPlaneTolerance();

  if ( count <= 0 || !p )
    return 0;

  if ( m_clip_plane_count <= 0 )
    return 2;

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  cv = &p[0].x;
  for ( i = count; i--; cv += 3 )
  {
    out = 0;
    //if ( m_clip_plane_count )
    {
      cpbit = 0x40;
      cpeqn = m_clip_plane;
      j = m_clip_plane_count;
      while (j--)
      {
        x = cpeqn->x*cv[0] + cpeqn->y*cv[1] + cpeqn->z*cv[2] + cpeqn->d;
        if ( x < -clip_plane_tolerance )
          out |= cpbit;
        cpbit <<= 1;
        cpeqn++;
      }
    }
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}